

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)15>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  uint rgb;
  ulong uVar2;
  float fVar3;
  QRgbaFloat<float> QVar4;
  
  uVar2 = 0;
  if (count < 1) {
    count = 0;
  }
  for (; (uint)(count * 2) != uVar2; uVar2 = uVar2 + 2) {
    rgb = convertPixelToARGB32PM<(QImage::Format)15>
                    ((uint)*(ushort *)(src + uVar2 + (long)index * 2));
    QVar4 = QRgbaFloat<float>::fromArgb32(rgb);
    fVar3 = QVar4.a;
    pfVar1 = &buffer->r + uVar2 * 2;
    *pfVar1 = QVar4.r * fVar3;
    pfVar1[1] = QVar4.g * fVar3;
    pfVar1[2] = fVar3 * QVar4.b;
    pfVar1[3] = fVar3;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}